

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm.cpp
# Opt level: O2

int __thiscall ncnn::GroupNorm::load_model(GroupNorm *this,ModelBin *mb)

{
  int iVar1;
  Mat MStack_78;
  
  iVar1 = 0;
  if (this->affine != 0) {
    (*mb->_vptr_ModelBin[2])(&MStack_78,mb,(ulong)(uint)this->channels,1);
    Mat::operator=(&this->gamma_data,&MStack_78);
    Mat::~Mat(&MStack_78);
    if (((this->gamma_data).data != (void *)0x0) &&
       ((long)(this->gamma_data).c * (this->gamma_data).cstep != 0)) {
      (*mb->_vptr_ModelBin[2])(&MStack_78,mb,(ulong)(uint)this->channels,1);
      Mat::operator=(&this->beta_data,&MStack_78);
      Mat::~Mat(&MStack_78);
      if (((this->beta_data).data != (void *)0x0) &&
         ((long)(this->beta_data).c * (this->beta_data).cstep != 0)) {
        return 0;
      }
    }
    iVar1 = -100;
  }
  return iVar1;
}

Assistant:

int GroupNorm::load_model(const ModelBin& mb)
{
    if (affine == 0)
        return 0;

    gamma_data = mb.load(channels, 1);
    if (gamma_data.empty())
        return -100;

    beta_data = mb.load(channels, 1);
    if (beta_data.empty())
        return -100;

    return 0;
}